

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O1

uint32_t __thiscall
ddd::DictionaryMLT<false,_true>::delete_key(DictionaryMLT<false,_true> *this,char *key)

{
  long *plVar1;
  uint32_t uVar2;
  bool bVar3;
  uint32_t uVar4;
  unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
  *this_00;
  ulong uVar5;
  Query query;
  Query local_38;
  
  local_38.pos_ = 0;
  local_38.value_ = 0x7fffffff;
  local_38.node_pos_ = 0;
  local_38.is_finished_ = false;
  local_38.key_ = key;
  bVar3 = DaTrie<false,_true,_true>::search_prefix
                    (*(DaTrie<false,_true,_true> **)(this + 8),&local_38);
  uVar2 = local_38.node_pos_;
  uVar4 = 0xffffffff;
  if (bVar3) {
    if (local_38.is_finished_ == true) {
      DaTrie<false,_true,_true>::delete_prefix_leaf
                (*(DaTrie<false,_true,_true> **)(this + 8),&local_38);
    }
    else {
      uVar4 = local_38.value_;
      uVar5 = (ulong)local_38.value_;
      local_38.node_pos_ = 0;
      bVar3 = DaTrie<false,_true,_false>::delete_key
                        (*(DaTrie<false,_true,_false> **)(*(long *)(this + 0x10) + uVar5 * 8),
                         &local_38);
      if (!bVar3) {
        return 0xffffffff;
      }
      plVar1 = *(long **)(*(long *)(this + 0x10) + uVar5 * 8);
      if (*plVar1 == plVar1[1]) {
        local_38.node_pos_ = uVar2;
        DaTrie<false,_true,_true>::delete_prefix_leaf
                  (*(DaTrie<false,_true,_true> **)(this + 8),&local_38);
        std::
        __uniq_ptr_impl<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
        ::reset((__uniq_ptr_impl<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                 *)(uVar5 * 8 + *(long *)(this + 0x10)),(pointer)0x0);
        if (*(long *)(this + 0x18) - *(long *)(this + 0x10) >> 3 == (ulong)(uVar4 + 1)) {
          this_00 = (unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                     *)(*(long *)(this + 0x18) + -8);
          *(unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
            **)(this + 0x18) = this_00;
          std::
          unique_ptr<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
          ::~unique_ptr(this_00);
        }
        else if (uVar4 < *(uint *)(this + 0x28)) {
          *(uint32_t *)(this + 0x28) = uVar4;
        }
      }
    }
    *(long *)(this + 0x30) = *(long *)(this + 0x30) + -1;
    uVar4 = local_38.value_;
  }
  return uVar4;
}

Assistant:

uint32_t delete_key(const char* key) {
    Query query(key);

    if (!prefix_subtrie_->search_prefix(query)) {
      return NOT_FOUND;
    }

    if (query.is_finished()) {
      prefix_subtrie_->delete_prefix_leaf(query);
      --num_keys_;
      return query.value();
    }

    auto leaf_pos = query.node_pos();
    auto suffix_id = query.value();

    query.set_node_pos(ROOT_POS);
    if (!suffix_subtries_[suffix_id]->delete_key(query)) {
      return NOT_FOUND;
    }

    if (suffix_subtries_[suffix_id]->is_empty()) { // update suffix link
      query.set_node_pos(leaf_pos);
      prefix_subtrie_->delete_prefix_leaf(query);
      suffix_subtries_[suffix_id].reset();

      if (suffix_id + 1 == suffix_subtries_.size()) {
        suffix_subtries_.pop_back();
      } else if (suffix_id < suffix_head_) {
        suffix_head_ = suffix_id;
      }
    }

    --num_keys_;
    return query.value();
  }